

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::insert
          (SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U> *this,uint *key,
          bool *value)

{
  uint uVar1;
  Node *pNVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  if (*key == 0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<unsigned int, bool, SmallDenseMapUnsignedHasher, 128>::insert(const Key &, const Value &) [Key = unsigned int, Value = bool, Hasher = SmallDenseMapUnsignedHasher, N = 128]"
                 );
  }
  if (this->bucketCount <= (this->count >> 2) + this->count) {
    rehash(this);
  }
  uVar1 = this->bucketCount;
  if (uVar1 != 0) {
    uVar3 = *key * -0x61c88647 & uVar1 - 1;
    pNVar2 = this->data;
    uVar4 = 1;
    do {
      if (pNVar2[uVar3].key == 0) {
        pNVar2[uVar3].key = *key;
        pNVar2[uVar3].value = *value;
        this->count = this->count + 1;
LAB_0011cd15:
        bVar5 = false;
      }
      else {
        if (pNVar2[uVar3].key == *key) {
          pNVar2[uVar3].value = *value;
          goto LAB_0011cd15;
        }
        uVar3 = uVar3 + uVar4 & uVar1 - 1;
        bVar5 = true;
      }
      if (!bVar5) {
        return;
      }
      bVar5 = uVar4 != uVar1;
      uVar4 = uVar4 + 1;
    } while (bVar5);
  }
  __assert_fail("!\"couldn\'t insert node\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0x5b,
                "void SmallDenseMap<unsigned int, bool, SmallDenseMapUnsignedHasher, 128>::insert(const Key &, const Value &) [Key = unsigned int, Value = bool, Hasher = SmallDenseMapUnsignedHasher, N = 128]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}